

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

base_learner * ect_setup(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar3;
  pointer peVar4;
  base_learner *this;
  single_learner *base_00;
  long *in_RDI;
  learner<ect,_example> *l;
  base_learner *base;
  size_t wpp;
  option_group_definition new_options;
  string link;
  free_ptr<ect> data;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  vw *in_stack_fffffffffffff940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff950;
  prediction_type_t pred_type;
  undefined6 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98e;
  undefined1 in_stack_fffffffffffff98f;
  option_group_definition *in_stack_fffffffffffff990;
  allocator local_5b1;
  string local_5b0 [39];
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [56];
  learner<char,_char> *in_stack_fffffffffffffb00;
  uint64_t in_stack_fffffffffffffb08;
  uint64_t in_stack_fffffffffffffb10;
  ect *in_stack_fffffffffffffb18;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  typed_option<unsigned_long> local_388 [2];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  typed_option<unsigned_long> local_1f8 [2];
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [56];
  string local_48 [56];
  long *local_10;
  base_learner *local_8;
  
  local_10 = in_RDI;
  scoped_calloc_or_throw<ect>();
  std::__cxx11::string::string(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Error Correcting Tournament Options",&local_a1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff940,
             (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"ect",&local_219);
  std::unique_ptr<ect,_void_(*)(void_*)>::operator->((unique_ptr<ect,_void_(*)(void_*)> *)0x36f065);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff948,(unsigned_long *)in_stack_fffffffffffff940);
  VW::config::typed_option<unsigned_long>::keep(local_1f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"Error correcting tournament with <k> labels",&local_241);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940,
             (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff990,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_fffffffffffff98f,
                      CONCAT16(in_stack_fffffffffffff98e,in_stack_fffffffffffff988)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"error",&local_3a9);
  std::unique_ptr<ect,_void_(*)(void_*)>::operator->((unique_ptr<ect,_void_(*)(void_*)> *)0x36f163);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff948,(unsigned_long *)in_stack_fffffffffffff940);
  VW::config::typed_option<unsigned_long>::keep(local_388,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff950,
             (unsigned_long)in_stack_fffffffffffff948);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"errors allowed by ECT",&local_3d1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940,
             (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff990,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_fffffffffffff98f,
                      CONCAT16(in_stack_fffffffffffff98e,in_stack_fffffffffffff988)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"link",&local_539);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff948,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"identity",&local_561);
  ptVar3 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(ptVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_588,"Specify the link function: identity, logistic, glf1 or poisson",&local_589);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff940,
       (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff940,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff990,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff98f,
                         CONCAT16(in_stack_fffffffffffff98e,in_stack_fffffffffffff988)));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  (**(code **)*local_10)(local_10,local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"ect",&local_5b1);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_5b0);
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  if ((bVar1 & 1) == 0) {
    peVar4 = std::unique_ptr<ect,_void_(*)(void_*)>::get
                       ((unique_ptr<ect,_void_(*)(void_*)> *)in_stack_fffffffffffff940);
    pred_type = (prediction_type_t)peVar4;
    std::unique_ptr<ect,_void_(*)(void_*)>::operator->
              ((unique_ptr<ect,_void_(*)(void_*)> *)0x36f8d1);
    std::unique_ptr<ect,_void_(*)(void_*)>::operator->
              ((unique_ptr<ect,_void_(*)(void_*)> *)0x36f8e3);
    create_circuit(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    this = setup_base((options_i *)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (iVar2 == 0) {
      peVar4 = std::unique_ptr<ect,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ect,_void_(*)(void_*)> *)0x36f95c);
      peVar4->class_boundary = 0.5;
    }
    base_00 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffb00);
    ptVar3 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)LEARNER::init_multiclass_learner<ect,example,LEARNER::learner<char,example>>
                          ((free_ptr<ect> *)this,base_00,
                           (_func_void_ect_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffff950,
                           (_func_void_ect_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffff948,(parser *)in_stack_fffffffffffff940,
                           CONCAT44(in_stack_fffffffffffff93c,4),pred_type);
    in_stack_fffffffffffff950 = ptVar3;
    LEARNER::learner<ect,_example>::set_finish
              ((learner<ect,_example> *)this,(_func_void_ect_ptr *)base_00);
    local_8 = LEARNER::make_base<ect,example>((learner<ect,_example> *)ptVar3);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<ect,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<ect,_void_(*)(void_*)> *)in_stack_fffffffffffff950);
  return local_8;
}

Assistant:

base_learner* ect_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<ect>();
  std::string link;
  option_group_definition new_options("Error Correcting Tournament Options");
  new_options.add(make_option("ect", data->k).keep().help("Error correcting tournament with <k> labels"))
      .add(make_option("error", data->errors).keep().default_value(0).help("errors allowed by ECT"))
      // Used to check value. TODO replace
      .add(make_option("link", link)
               .default_value("identity")
               .keep()
               .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("ect"))
    return nullptr;

  size_t wpp = create_circuit(*data.get(), data->k, data->errors + 1);

  base_learner* base = setup_base(options, all);
  if (link.compare("logistic") == 0)
    data->class_boundary = 0.5;  // as --link=logistic maps predictions in [0;1]

  learner<ect, example>& l = init_multiclass_learner(data, as_singleline(base), learn, predict, all.p, wpp);
  l.set_finish(finish);

  return make_base(l);
}